

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnEvent(SharedValidator *this,Location *loc,Var *sig_var)

{
  bool bVar1;
  value_type local_c8;
  Enum local_ac;
  Var local_a8;
  Enum local_5c;
  undefined1 local_58 [8];
  FuncType type;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)sig_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  FuncType::FuncType((FuncType *)local_58);
  Var::Var(&local_a8,sig_var);
  local_5c = (Enum)CheckFuncTypeIndex(this,&local_a8,(FuncType *)local_58);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_5c);
  Var::~Var(&local_a8);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                     &type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    local_ac = (Enum)PrintError(this,loc,"Event signature must have 0 results.");
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_ac);
  }
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_c8.params,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_58);
  std::vector<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>::
  push_back(&this->events_,&local_c8);
  EventType::~EventType(&local_c8);
  FuncType::~FuncType((FuncType *)local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnEvent(const Location& loc, Var sig_var) {
  Result result = Result::Ok;
  FuncType type;
  result |= CheckFuncTypeIndex(sig_var, &type);
  if (!type.results.empty()) {
    result |= PrintError(loc, "Event signature must have 0 results.");
  }
  events_.push_back(EventType{type.params});
  return result;
}